

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O1

void __thiscall Assimp::AMFImporter::ParseNode_Object(AMFImporter *this)

{
  size_t *psVar1;
  CAMFImporter_NodeElement *pCVar2;
  AMFImporter *this_00;
  char *pcVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _Alloc_hider _Var7;
  _List_node_base *p_Var8;
  undefined8 uVar9;
  undefined8 extraout_RAX;
  undefined8 uVar10;
  undefined8 extraout_RAX_00;
  AMFImporter *this_01;
  char *__end;
  uint uVar11;
  ulong uVar12;
  pointer pcVar13;
  string an;
  string id;
  undefined1 local_a8 [36];
  uint local_84;
  AMFImporter *local_80;
  undefined1 *local_78;
  char *local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  _Alloc_hider local_58;
  string local_50;
  
  this_01 = (AMFImporter *)local_a8;
  local_78 = &local_68;
  local_70 = (char *)0x0;
  local_68 = 0;
  uVar4 = (*this->mReader->_vptr_IIrrXMLReader[4])();
  local_80 = this;
  if (0 < (int)uVar4) {
    uVar12 = 0;
    do {
      iVar5 = (*local_80->mReader->_vptr_IIrrXMLReader[5])(local_80->mReader,uVar12);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_a8,(char *)CONCAT44(extraout_var,iVar5),
                 (allocator<char> *)&local_50);
      iVar5 = std::__cxx11::string::compare(local_a8);
      if (iVar5 != 0) goto LAB_003ed6ed;
      iVar5 = (*local_80->mReader->_vptr_IIrrXMLReader[6])();
      pcVar3 = local_70;
      strlen((char *)CONCAT44(extraout_var_00,iVar5));
      std::__cxx11::string::_M_replace((ulong)&local_78,0,pcVar3,CONCAT44(extraout_var_00,iVar5));
      if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
        operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
      }
      uVar11 = (int)uVar12 + 1;
      uVar12 = (ulong)uVar11;
    } while (uVar4 != uVar11);
  }
  this_00 = local_80;
  _Var7._M_p = (pointer)operator_new(0x50);
  pCVar2 = this_00->mNodeElement_Cur;
  ((CAMFImporter_NodeElement *)_Var7._M_p)->Type = 8;
  (((CAMFImporter_NodeElement *)_Var7._M_p)->ID)._M_dataplus._M_p =
       (pointer)&(((CAMFImporter_NodeElement *)_Var7._M_p)->ID).field_2;
  (((CAMFImporter_NodeElement *)_Var7._M_p)->ID)._M_string_length = 0;
  (((CAMFImporter_NodeElement *)_Var7._M_p)->ID).field_2._M_local_buf[0] = '\0';
  ((CAMFImporter_NodeElement *)_Var7._M_p)->Parent = pCVar2;
  (((CAMFImporter_NodeElement *)_Var7._M_p)->Child).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
  (((CAMFImporter_NodeElement *)_Var7._M_p)->Child).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  (((CAMFImporter_NodeElement *)_Var7._M_p)->Child).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev =
       (_List_node_base *)&((CAMFImporter_NodeElement *)_Var7._M_p)->Child;
  (((CAMFImporter_NodeElement *)_Var7._M_p)->Child).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_next =
       (_List_node_base *)&((CAMFImporter_NodeElement *)_Var7._M_p)->Child;
  (((CAMFImporter_NodeElement *)_Var7._M_p)->Child).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node._M_size = 0;
  ((CAMFImporter_NodeElement *)_Var7._M_p)->_vptr_CAMFImporter_NodeElement =
       (_func_int **)&PTR__CAMFImporter_NodeElement_0082e228;
  if (local_70 != (char *)0x0) {
    std::__cxx11::string::_M_assign((string *)&((CAMFImporter_NodeElement *)_Var7._M_p)->ID);
  }
  iVar5 = (*this_00->mReader->_vptr_IIrrXMLReader[0xf])();
  pCVar2 = this_00->mNodeElement_Cur;
  if ((char)iVar5 == '\0') {
    p_Var8 = (_List_node_base *)operator_new(0x18);
    p_Var8[1]._M_next = (_List_node_base *)_Var7._M_p;
    std::__detail::_List_node_base::_M_hook(p_Var8);
    psVar1 = &(pCVar2->Child).
              super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    this_00->mNodeElement_Cur = (CAMFImporter_NodeElement *)_Var7._M_p;
    local_84 = 0;
    local_58._M_p = _Var7._M_p;
    do {
      do {
        while( true ) {
          pcVar13 = local_a8 + 0x10;
          iVar5 = (*this_00->mReader->_vptr_IIrrXMLReader[2])();
          if ((char)iVar5 == '\0') goto LAB_003ed6cc;
          iVar6 = (*this_00->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar6 != 1) break;
          local_a8._0_8_ = pcVar13;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"color","");
          (*this_00->mReader->_vptr_IIrrXMLReader[0xd])();
          uVar9 = std::__cxx11::string::compare(local_a8);
          uVar10 = uVar9;
          if ((pointer)local_a8._0_8_ != pcVar13) {
            operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
            uVar10 = extraout_RAX;
          }
          if ((int)uVar9 == 0) {
            if ((local_84 & 1) != 0) goto LAB_003ed6fa;
            local_84 = (uint)CONCAT71((int7)((ulong)uVar10 >> 8),1);
            ParseNode_Color(this_00);
          }
          else {
            local_a8._0_8_ = pcVar13;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"mesh","");
            (*this_00->mReader->_vptr_IIrrXMLReader[0xd])();
            iVar5 = std::__cxx11::string::compare(local_a8);
            if ((pointer)local_a8._0_8_ != pcVar13) {
              operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
            }
            if (iVar5 == 0) {
              ParseNode_Mesh(this_00);
            }
            else {
              local_a8._0_8_ = pcVar13;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"metadata","");
              (*this_00->mReader->_vptr_IIrrXMLReader[0xd])();
              iVar5 = std::__cxx11::string::compare(local_a8);
              if ((pointer)local_a8._0_8_ != pcVar13) {
                operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
              }
              if (iVar5 == 0) {
                ParseNode_Metadata(this_00);
              }
              else {
                local_a8._0_8_ = pcVar13;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"object","");
                XML_CheckNode_SkipUnsupported(this_00,(string *)local_a8);
                if ((pointer)local_a8._0_8_ != pcVar13) {
                  operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
                }
              }
            }
          }
        }
        iVar6 = (*this_00->mReader->_vptr_IIrrXMLReader[3])();
      } while (iVar6 != 2);
      local_a8._0_8_ = pcVar13;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"object","");
      (*this_00->mReader->_vptr_IIrrXMLReader[0xd])();
      iVar6 = std::__cxx11::string::compare(local_a8);
      if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
        operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
      }
    } while (iVar6 != 0);
    if ((char)iVar5 == '\0') {
LAB_003ed6cc:
      local_a8._0_8_ = local_a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"object","");
      Throw_CloseNotFound(this_01,(string *)local_a8);
LAB_003ed6ed:
      Throw_IncorrectAttr(local_80,(string *)local_a8);
LAB_003ed6fa:
      local_a8._0_8_ = local_a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"color","");
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Only one color can be defined for <object>.","");
      Throw_MoreThanOnceDefined(local_80,(string *)local_a8,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
        operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
      }
      if (local_78 != &local_68) {
        operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
      }
      _Unwind_Resume(extraout_RAX_00);
    }
    _Var7._M_p = local_58._M_p;
    if (this_00->mNodeElement_Cur != (CAMFImporter_NodeElement *)0x0) {
      this_00->mNodeElement_Cur = this_00->mNodeElement_Cur->Parent;
    }
  }
  else {
    p_Var8 = (_List_node_base *)operator_new(0x18);
    p_Var8[1]._M_next = (_List_node_base *)_Var7._M_p;
    std::__detail::_List_node_base::_M_hook(p_Var8);
    psVar1 = &(pCVar2->Child).
              super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  p_Var8 = (_List_node_base *)operator_new(0x18);
  p_Var8[1]._M_next = (_List_node_base *)_Var7._M_p;
  std::__detail::_List_node_base::_M_hook(p_Var8);
  psVar1 = &(this_00->mNodeElement_List).
            super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if (local_78 != &local_68) {
    operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
  }
  return;
}

Assistant:

void AMFImporter::ParseNode_Object()
{
    std::string id;
    CAMFImporter_NodeElement* ne( nullptr );

	// Read attributes for node <object>.
	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECK_RET("id", id, mReader->getAttributeValue);
	MACRO_ATTRREAD_LOOPEND;

	// create and if needed - define new geometry object.
	ne = new CAMFImporter_NodeElement_Object(mNodeElement_Cur);

	CAMFImporter_NodeElement_Object& als = *((CAMFImporter_NodeElement_Object*)ne);// alias for convenience

	if(!id.empty()) als.ID = id;
	// Check for child nodes
	if(!mReader->isEmptyElement())
	{
		bool col_read = false;

		ParseHelper_Node_Enter(ne);
		MACRO_NODECHECK_LOOPBEGIN("object");
			if(XML_CheckNode_NameEqual("color"))
			{
				// Check if color already defined for object.
				if(col_read) Throw_MoreThanOnceDefined("color", "Only one color can be defined for <object>.");
				// read data and set flag about it
				ParseNode_Color();
				col_read = true;

				continue;
			}

			if(XML_CheckNode_NameEqual("mesh")) { ParseNode_Mesh(); continue; }
			if(XML_CheckNode_NameEqual("metadata")) { ParseNode_Metadata(); continue; }
		MACRO_NODECHECK_LOOPEND("object");
		ParseHelper_Node_Exit();
	}// if(!mReader->isEmptyElement())
	else
	{
		mNodeElement_Cur->Child.push_back(ne);// Add element to child list of current element
	}// if(!mReader->isEmptyElement()) else

	mNodeElement_List.push_back(ne);// and to node element list because its a new object in graph.
}